

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::AppendUserMessage(string *gtest_msg,Message *user_msg)

{
  ulong uVar1;
  string *in_RSI;
  string *in_RDI;
  string user_msg_string;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_38 [40];
  string *local_10;
  
  __rhs = in_RDI;
  local_10 = in_RSI;
  Message::GetString_abi_cxx11_((Message *)in_stack_ffffffffffffff98);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   in_stack_ffffffffffffffb0);
    std::operator+(in_stack_ffffffffffffff98,__rhs);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_10);
  }
  std::__cxx11::string::~string(local_38);
  return __rhs;
}

Assistant:

std::string AppendUserMessage(const std::string& gtest_msg,
                              const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const std::string user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  return gtest_msg + "\n" + user_msg_string;
}